

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O0

void test_open_address_dictionary_cursor_equality(planck_unit_test_t *tc)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  undefined4 local_b4;
  undefined1 local_b0 [8];
  ion_predicate_t predicate;
  ion_dict_cursor_t *cursor;
  ion_dictionary_t test_dictionary;
  ion_dictionary_handler_t map_handler;
  ion_record_info_t record;
  int size;
  planck_unit_test_t *tc_local;
  
  map_handler.close_dictionary._4_4_ = 4;
  createTestDictionary
            ((ion_dictionary_handler_t *)&test_dictionary.handler,
             (ion_record_info_t *)((long)&map_handler.close_dictionary + 4),10,
             (ion_dictionary_t *)&cursor,key_type_numeric_signed);
  local_b4 = 1;
  dictionary_build_predicate((ion_predicate_t *)local_b0,'\0',&local_b4);
  iVar1 = dictionary_find((ion_dictionary_t *)&cursor,(ion_predicate_t *)local_b0,
                          (ion_dict_cursor_t **)&predicate.destroy);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0xa5,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*predicate.destroy == (_func_void_ion_predicate_t_ptr_ptr)0x2),0xa8,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  (**(code **)(predicate.destroy + 0x20))(&predicate.destroy);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(predicate.destroy == (_func_void_ion_predicate_t_ptr_ptr *)0x0),0xae,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  dictionary_delete_dictionary((ion_dictionary_t *)&cursor);
  return;
}

Assistant:

void
test_open_address_dictionary_cursor_equality(
	planck_unit_test_t *tc
) {
	int					size;
	ion_record_info_t	record;

	/* this is required for initializing the hash map and should come from the dictionary */
	record.key_size		= sizeof(int);
	record.value_size	= 10;
	size				= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t *cursor;	/* create a new cursor pointer */

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_equality, IONIZE(1, int));

	/* test that the query runs on dictionary instance okay */
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == dictionary_find(&test_dictionary, &predicate, &cursor));

	/* check the status of the cursor as it should be initialized */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_initialized == cursor->status);

	/* destroy the cursor */
	cursor->destroy(&cursor);

	/* and check that cursor has been destroyed correctly */
	PLANCK_UNIT_ASSERT_TRUE(tc, NULL == cursor);

	/* and destroy the dictionary instance */
	dictionary_delete_dictionary(&test_dictionary);
}